

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

char * TextToPascal(char *text)

{
  __int32_t **pp_Var1;
  int i;
  long lVar2;
  int iVar3;
  char cVar4;
  long lVar5;
  
  pp_Var1 = __ctype_toupper_loc();
  TextToPascal::buffer[0] = (char)(*pp_Var1)[*text];
  iVar3 = 1;
  lVar2 = 1;
  do {
    if (lVar2 == 0x400) {
      return TextToPascal::buffer;
    }
    cVar4 = text[iVar3];
    if (cVar4 == '_') {
      lVar5 = (long)iVar3;
      iVar3 = iVar3 + 1;
      cVar4 = (char)(*pp_Var1)[text[lVar5 + 1]];
    }
    else if (cVar4 == '\0') {
      TextToPascal::buffer[lVar2] = '\0';
      return TextToPascal::buffer;
    }
    TextToPascal::buffer[lVar2] = cVar4;
    lVar2 = lVar2 + 1;
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

const char *TextToPascal(const char *text)
{
    static char buffer[MAX_TEXT_BUFFER_LENGTH] = { 0 };

    buffer[0] = (char)toupper(text[0]);

    for (int i = 1, j = 1; i < MAX_TEXT_BUFFER_LENGTH; i++, j++)
    {
        if (text[j] != '\0')
        {
            if (text[j] != '_') buffer[i] = text[j];
            else
            {
                j++;
                buffer[i] = (char)toupper(text[j]);
            }
        }
        else { buffer[i] = '\0'; break; }
    }

    return buffer;
}